

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Skeleton *skel,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  tinyusdz *ptVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *attr;
  TypedAttributeWithFallback<tinyusdz::Purpose> *attr_00;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr_01;
  uint32_t indent_00;
  uint32_t uVar6;
  string *psVar7;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t indent_01;
  undefined7 in_register_00000081;
  string local_560;
  string local_540;
  allocator local_519;
  string local_518;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  string local_4b0;
  allocator local_489;
  string local_488;
  string local_468;
  string local_448;
  allocator local_421;
  string local_420;
  ListEditQual local_3fc;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  ListEditQual local_3ac;
  string local_3a8;
  allocator local_381;
  undefined1 local_380 [32];
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  Skeleton *skel_local;
  
  indent_01 = (uint32_t)CONCAT71(in_register_00000081,closing_brace);
  local_1c = (uint)skel;
  local_1d = (byte)indent & 1;
  psVar7 = __return_storage_ptr__;
  ptStack_18 = this;
  skel_local = (Skeleton *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar7;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0xc0),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," Skeleton \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(ptStack_18 + 0xa0));
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)(ptStack_18 + 0x1808));
  uVar6 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,ptStack_18 + 0x1808,(PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    uVar6 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar6);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  ptVar3 = ptStack_18 + 0xd0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2a8,"bindTransforms",&local_2a9);
  print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            ((string *)(local_2a8 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              *)local_2a8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  ptVar3 = ptStack_18 + 800;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f0,"jointNames",&local_2f1);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((string *)(local_2f0 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_2f0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  ptVar3 = ptStack_18 + 0x570;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_338,"joints",&local_339);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((string *)(local_338 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_338,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  ptVar3 = ptStack_18 + 0x7c0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_380,"restTransforms",&local_381);
  uVar6 = local_1c + 1;
  print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            ((string *)(local_380 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              *)local_380,(string *)(ulong)uVar6,indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)local_380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(ptStack_18 + 0xd20));
  if (bVar1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0xd20));
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0xd20));
    local_3ac = Relationship::get_listedit_qual(pvVar5);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3d0,"skel:animationSource",&local_3d1);
    uVar6 = 0;
    anon_unknown_173::print_relationship(&local_3a8,pvVar4,&local_3ac,false,&local_3d0,local_1c + 1)
    ;
    ::std::operator<<(aoStack_198,(string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(ptStack_18 + 0xa10));
  if (bVar1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0xa10));
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0xa10));
    local_3fc = Relationship::get_listedit_qual(pvVar5);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_420,"proxyPrim",&local_421);
    uVar6 = 0;
    anon_unknown_173::print_relationship(&local_3f8,pvVar4,&local_3fc,false,&local_420,local_1c + 1)
    ;
    ::std::operator<<(aoStack_198,(string *)&local_3f8);
    ::std::__cxx11::string::~string((string *)&local_3f8);
    ::std::__cxx11::string::~string((string *)&local_420);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
  }
  print_xformOps_abi_cxx11_
            (&local_448,ptStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)(local_1c + 1),
             uVar6);
  ::std::operator<<(aoStack_198,(string *)&local_448);
  ::std::__cxx11::string::~string((string *)&local_448);
  attr = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
         (ptStack_18 + 0x1030);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_488,"visibility",&local_489);
  print_typed_token_attr<tinyusdz::Visibility>(&local_468,attr,&local_488,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_468);
  ::std::__cxx11::string::~string((string *)&local_468);
  ::std::__cxx11::string::~string((string *)&local_488);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_489);
  attr_00 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)(ptStack_18 + 0x1530);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_4d0,"purpose",&local_4d1);
  print_typed_token_attr<tinyusdz::Purpose>(&local_4b0,attr_00,&local_4d0,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_4b0);
  ::std::__cxx11::string::~string((string *)&local_4b0);
  ::std::__cxx11::string::~string((string *)&local_4d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  attr_01 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(ptStack_18 + 0x12b8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_518,"extent",&local_519);
  print_typed_attr<tinyusdz::Extent>(&local_4f8,attr_01,&local_518,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_4f8);
  ::std::__cxx11::string::~string((string *)&local_4f8);
  ::std::__cxx11::string::~string((string *)&local_518);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_519);
  print_props(&local_540,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0x17d8),local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_540);
  ::std::__cxx11::string::~string((string *)&local_540);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_560,(pprint *)(ulong)local_1c,n_02);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_560);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_560);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Skeleton &skel, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(skel.spec) << " Skeleton \""
     << skel.name << "\"\n";
  if (skel.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(skel.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(skel.bindTransforms, "bindTransforms", indent + 1);
  ss << print_typed_attr(skel.jointNames, "jointNames", indent + 1);
  ss << print_typed_attr(skel.joints, "joints", indent + 1);
  ss << print_typed_attr(skel.restTransforms, "restTransforms", indent + 1);

  if (skel.animationSource) {
    ss << print_relationship(skel.animationSource.value(),
                             skel.animationSource.value().get_listedit_qual(),
                             /* custom */ false, "skel:animationSource",
                             indent + 1);
  }

  if (skel.proxyPrim) {
    ss << print_relationship(skel.proxyPrim.value(),
                             skel.proxyPrim.value().get_listedit_qual(),
                             /* custom */ false, "proxyPrim", indent + 1);
  }

  ss << print_xformOps(skel.xformOps, indent + 1);

  ss << print_typed_token_attr(skel.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(skel.purpose, "purpose", indent + 1);
  ss << print_typed_attr(skel.extent, "extent", indent + 1);

  ss << print_props(skel.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}